

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

bool BasicBlock::IsLegalForPathDepBranches(Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  byte unaff_BL;
  
  if (instr != (Instr *)0x0) {
    do {
      if ((((5 < instr->m_kind) || ((0x2cU >> (instr->m_kind & 0x1f) & 1) == 0)) &&
          (bVar3 = IsLegalOpcodeForPathDepBrFold(instr), !bVar3)) ||
         (((instr->m_kind == InstrKindProfiledLabel || (instr->m_kind == InstrKindLabel)) &&
          (((ulong)instr[1].m_func & 1) != 0)))) goto LAB_00422388;
      if (instr->m_kind == InstrKindBranch) {
        OVar1 = instr->m_opcode;
        if (OVar1 < ADD) {
          bVar3 = OVar1 == MultiBr || OVar1 == Br;
        }
        else {
          bVar3 = LowererMD::IsUnconditionalBranch(instr);
        }
        if (bVar3 == false) {
          unaff_BL = 1;
LAB_00422329:
          bVar3 = false;
        }
        else {
          if (instr[1].m_next == (Instr *)0x0) {
            unaff_BL = 0;
            goto LAB_00422329;
          }
          bVar3 = true;
          instr = instr[1].m_next;
        }
        if (!bVar3) goto LAB_0042238a;
      }
      else {
        instr = instr->m_next;
      }
    } while (instr != (Instr *)0x0);
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                     ,0x1244,"((0))","UNREACHED");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar4 = 0;
LAB_00422388:
  unaff_BL = 0;
LAB_0042238a:
  return (bool)(unaff_BL & 1);
}

Assistant:

bool
BasicBlock::IsLegalForPathDepBranches(IR::Instr* instr)
{
    while (instr)
    {
        if (!instr->IsBranchInstr() && !instr->IsLabelInstr() && !IsLegalOpcodeForPathDepBrFold(instr))
        {
            return false;
        }
        if (instr->IsLabelInstr())
        {
            if (instr->AsLabelInstr()->m_isLoopTop)
            {
                // don't cross over to loops
                return false;
            }
        }
        if (instr->IsBranchInstr())
        {
            IR::BranchInstr* branch = instr->AsBranchInstr();
            if (branch->IsUnconditional())
            {
                if (!branch->GetTarget())
                {
                    return false;
                }
                instr = branch->GetTarget();
            }
            else
            {
                // Found only legal instructions until a conditional branch, build expensive data structures and check provability
                return true;
            }
        }
        else
        {
            instr = instr->m_next;
        }
    }

    Assert(UNREACHED);
    return false;
}